

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::GetObservedCoords(CECoordinates *this,CEDate *date,CEObserver *observer)

{
  CEObserver *in_RCX;
  long *in_RSI;
  CECoordinates *in_RDI;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  CEObserver *local_48;
  
  local_48 = in_RCX;
  local_50 = CEDate::operator_cast_to_double((CEDate *)0x14e567);
  local_58 = CEObserver::Longitude_Rad(local_48);
  local_60 = CEObserver::Latitude_Rad(local_48);
  local_68 = CEObserver::Elevation_m(local_48);
  local_70 = CEObserver::Pressure_hPa(local_48);
  local_78 = CEObserver::Temperature_C(local_48);
  local_80 = CEObserver::RelativeHumidity(local_48);
  local_88 = CEDate::dut1((CEDate *)0x14e5fe);
  local_90 = CEDate::xpolar((CEDate *)0x14e611);
  local_98 = CEDate::ypolar((CEDate *)0x14e624);
  local_a0 = CEObserver::Wavelength_um(local_48);
  (**(code **)(*in_RSI + 0x48))
            (in_RDI,in_RSI,&local_50,&local_58,&local_60,&local_68,&local_70,&local_78,&local_80,
             &local_88,&local_90,&local_98,&local_a0);
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::GetObservedCoords(const CEDate& date,
                                               const CEObserver& observer) const
{
    return GetObservedCoords(date,
                             observer.Longitude_Rad(),
                             observer.Latitude_Rad(),
                             observer.Elevation_m(),
                             observer.Pressure_hPa(),
                             observer.Temperature_C(),
                             observer.RelativeHumidity(),
                             date.dut1(), 
                             date.xpolar(), 
                             date.ypolar(), 
                             observer.Wavelength_um());
}